

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::TableEndRow(ImGuiTable *table)

{
  float fVar1;
  char cVar2;
  ImGuiWindow *pIVar3;
  ImDrawList *pIVar4;
  ImGuiContext *pIVar5;
  ImRect IVar6;
  ImRect IVar7;
  ImGuiTableCellData *pIVar8;
  ImGuiTableCellData *pIVar9;
  ImGuiTableColumn *pIVar10;
  long in_RDI;
  bool bVar11;
  bool bVar12;
  float fVar13;
  float fVar14;
  ImVec4 IVar15;
  ImGuiTableColumn *column_2;
  int column_n_1;
  float row_height;
  float y0;
  ImGuiTableColumn *column_1;
  int column_n;
  ImRect cell_bg_rect;
  ImGuiTableColumn *column;
  ImGuiTableCellData *cell_data;
  ImGuiTableCellData *cell_data_end;
  ImRect row_rect;
  bool draw_strong_bottom_border;
  bool draw_cell_bg_color;
  float border_size;
  ImU32 border_col;
  ImU32 bg_col1;
  ImU32 bg_col0;
  bool is_visible;
  bool unfreeze_rows_request;
  bool unfreeze_rows_actual;
  float bg_y2;
  float bg_y1;
  ImGuiWindow *window;
  ImGuiContext *g;
  undefined8 in_stack_ffffffffffffff10;
  ImRect *in_stack_ffffffffffffff18;
  ImGuiWindow *in_stack_ffffffffffffff20;
  ImDrawList *in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff30;
  uint in_stack_ffffffffffffff34;
  uint uVar16;
  int local_bc;
  float in_stack_ffffffffffffff58;
  ImU32 in_stack_ffffffffffffff5c;
  int iVar17;
  ImVec2 in_stack_ffffffffffffff60;
  ImVec2 in_stack_ffffffffffffff68;
  ImVec2 in_stack_ffffffffffffff70;
  ImVec2 local_88;
  ImRect local_80;
  char *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  ImVec2 *in_stack_ffffffffffffffa0;
  float local_54;
  float local_4c;
  undefined8 local_48;
  undefined8 local_40;
  int local_30;
  int local_2c;
  ImU32 local_28;
  
  pIVar5 = GImGui;
  pIVar3 = GImGui->CurrentWindow;
  if (*(int *)(in_RDI + 0x74) != -1) {
    TableEndCell((ImGuiTable *)in_stack_ffffffffffffff20);
  }
  if ((pIVar5->LogEnabled & 1U) != 0) {
    LogRenderedText(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  }
  (pIVar3->DC).CursorPos.y = *(float *)(in_RDI + 0x80);
  fVar14 = *(float *)(in_RDI + 0x7c);
  fVar1 = *(float *)(in_RDI + 0x80);
  bVar11 = *(int *)(in_RDI + 0x70) + 1 == (int)*(char *)(in_RDI + 0x241);
  iVar17 = *(int *)(in_RDI + 0x70);
  cVar2 = *(char *)(in_RDI + 0x240);
  if (*(int *)(in_RDI + 0x70) == 0) {
    *(float *)(in_RDI + 0xd0) = fVar1 - fVar14;
  }
  uVar16 = in_stack_ffffffffffffff34 & 0xffffff;
  if (*(float *)(in_RDI + 0x120) <= fVar1) {
    uVar16 = CONCAT13(fVar14 <= *(float *)(in_RDI + 0x128),(int3)in_stack_ffffffffffffff34);
  }
  if ((char)(uVar16 >> 0x18) != '\0') {
    local_28 = 0;
    local_2c = 0;
    if (*(int *)(in_RDI + 0x98) == 0x1000000) {
      if ((*(uint *)(in_RDI + 4) & 0x40) != 0) {
        local_28 = GetColorU32((ImGuiCol)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                               SUB84(in_stack_ffffffffffffff20,0));
      }
    }
    else {
      local_28 = *(ImU32 *)(in_RDI + 0x98);
    }
    if (*(int *)(in_RDI + 0x9c) != 0x1000000) {
      local_2c = *(int *)(in_RDI + 0x9c);
    }
    local_30 = 0;
    if (((0 < *(int *)(in_RDI + 0x70)) || (*(long *)(in_RDI + 0x1d0) == *(long *)(in_RDI + 0x1c8)))
       && ((*(uint *)(in_RDI + 4) & 0x80) != 0)) {
      if ((*(int *)(in_RDI + 0x90) >> 0x10 & 1U) == 0) {
        in_stack_ffffffffffffff30 = *(int *)(in_RDI + 0xa4);
        local_30 = in_stack_ffffffffffffff30;
      }
      else {
        in_stack_ffffffffffffff30 = *(int *)(in_RDI + 0xa0);
        local_30 = in_stack_ffffffffffffff30;
      }
    }
    bVar12 = -1 < *(char *)(in_RDI + 0x244);
    if ((((local_28 != 0 || local_2c != 0) || local_30 != 0) || (bVar11)) || (bVar12)) {
      if ((*(uint *)(in_RDI + 4) & 0x100000) == 0) {
        IVar15 = ImRect::ToVec4((ImRect *)0x1ae162);
        pIVar4 = pIVar3->DrawList;
        local_48 = IVar15._0_8_;
        (pIVar4->_CmdHeader).ClipRect.x = (float)(undefined4)local_48;
        (pIVar4->_CmdHeader).ClipRect.y = (float)local_48._4_4_;
        local_40 = IVar15._8_8_;
        (pIVar4->_CmdHeader).ClipRect.z = (float)(undefined4)local_40;
        (pIVar4->_CmdHeader).ClipRect.w = (float)local_40._4_4_;
      }
      ImDrawListSplitter::SetCurrentChannel
                ((ImDrawListSplitter *)CONCAT44(uVar16,in_stack_ffffffffffffff30),
                 in_stack_ffffffffffffff28,(int)((ulong)in_stack_ffffffffffffff20 >> 0x20));
    }
    if ((local_28 != 0) || (local_2c != 0)) {
      ImRect::ImRect((ImRect *)in_stack_ffffffffffffff20,
                     (float)((ulong)in_stack_ffffffffffffff18 >> 0x20),
                     SUB84(in_stack_ffffffffffffff18,0),
                     (float)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                     (float)in_stack_ffffffffffffff10);
      ImRect::ClipWith((ImRect *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      if ((local_28 != 0) && (local_54 < local_4c)) {
        ImDrawList::AddRectFilled
                  ((ImDrawList *)CONCAT44(uVar16,in_stack_ffffffffffffff30),
                   (ImVec2 *)in_stack_ffffffffffffff28,(ImVec2 *)in_stack_ffffffffffffff20,
                   (ImU32)((ulong)in_stack_ffffffffffffff18 >> 0x20),
                   SUB84(in_stack_ffffffffffffff18,0),
                   (ImDrawCornerFlags)((ulong)in_stack_ffffffffffffff10 >> 0x20));
      }
      if ((local_2c != 0) && (local_54 < local_4c)) {
        ImDrawList::AddRectFilled
                  ((ImDrawList *)CONCAT44(uVar16,in_stack_ffffffffffffff30),
                   (ImVec2 *)in_stack_ffffffffffffff28,(ImVec2 *)in_stack_ffffffffffffff20,
                   (ImU32)((ulong)in_stack_ffffffffffffff18 >> 0x20),
                   SUB84(in_stack_ffffffffffffff18,0),
                   (ImDrawCornerFlags)((ulong)in_stack_ffffffffffffff10 >> 0x20));
      }
    }
    if (bVar12) {
      pIVar8 = ImSpan<ImGuiTableCellData>::operator[]
                         ((ImSpan<ImGuiTableCellData> *)(in_RDI + 0x30),
                          (int)*(char *)(in_RDI + 0x244));
      for (pIVar9 = ImSpan<ImGuiTableCellData>::operator[]
                              ((ImSpan<ImGuiTableCellData> *)(in_RDI + 0x30),0); pIVar9 <= pIVar8;
          pIVar9 = pIVar9 + 1) {
        pIVar10 = ImSpan<ImGuiTableColumn>::operator[]
                            ((ImSpan<ImGuiTableColumn> *)(in_RDI + 0x10),(int)pIVar9->Column);
        local_80 = TableGetCellBgRect((ImGuiTable *)in_stack_ffffffffffffff20,
                                      (int)((ulong)in_stack_ffffffffffffff18 >> 0x20));
        ImRect::ClipWith((ImRect *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
        fVar13 = ImMax<float>(local_80.Min.x,(pIVar10->ClipRect).Min.x);
        IVar6 = local_80;
        local_80.Min.x = fVar13;
        IVar7 = local_80;
        local_80.Max.x = IVar6.Max.x;
        fVar13 = local_80.Max.x;
        local_80 = IVar7;
        fVar13 = ImMin<float>(fVar13,pIVar10->MaxX);
        local_80.Max.x = fVar13;
        ImDrawList::AddRectFilled
                  ((ImDrawList *)CONCAT44(uVar16,in_stack_ffffffffffffff30),
                   (ImVec2 *)in_stack_ffffffffffffff28,(ImVec2 *)in_stack_ffffffffffffff20,
                   (ImU32)((ulong)in_stack_ffffffffffffff18 >> 0x20),
                   SUB84(in_stack_ffffffffffffff18,0),
                   (ImDrawCornerFlags)((ulong)in_stack_ffffffffffffff10 >> 0x20));
      }
    }
    if (((local_30 != 0) && (*(float *)(in_RDI + 0x130) <= fVar14)) &&
       (fVar14 < *(float *)(in_RDI + 0x138))) {
      in_stack_ffffffffffffff28 = pIVar3->DrawList;
      ImVec2::ImVec2(&local_88,*(float *)(in_RDI + 0xa8),fVar14);
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff70,*(float *)(in_RDI + 0xac),fVar14);
      ImDrawList::AddLine((ImDrawList *)in_stack_ffffffffffffff70,
                          (ImVec2 *)in_stack_ffffffffffffff68,(ImVec2 *)in_stack_ffffffffffffff60,
                          in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58);
    }
    if (((bVar11) && (*(float *)(in_RDI + 0x130) <= fVar1)) && (fVar1 < *(float *)(in_RDI + 0x138)))
    {
      in_stack_ffffffffffffff20 = (ImGuiWindow *)pIVar3->DrawList;
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff68,*(float *)(in_RDI + 0xa8),fVar1);
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff60,*(float *)(in_RDI + 0xac),fVar1);
      ImDrawList::AddLine((ImDrawList *)in_stack_ffffffffffffff70,
                          (ImVec2 *)in_stack_ffffffffffffff68,(ImVec2 *)in_stack_ffffffffffffff60,
                          in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58);
    }
  }
  if (iVar17 + 1 == (int)cVar2) {
    for (iVar17 = 0; iVar17 < *(int *)(in_RDI + 0x6c); iVar17 = iVar17 + 1) {
      pIVar10 = ImSpan<ImGuiTableColumn>::operator[]
                          ((ImSpan<ImGuiTableColumn> *)(in_RDI + 0x10),iVar17);
      pIVar10->NavLayerCurrent = iVar17 < *(char *)(in_RDI + 0x243);
    }
  }
  if (bVar11) {
    *(undefined1 *)(in_RDI + 0x253) = 1;
    fVar14 = ImMax<float>(*(float *)(in_RDI + 0x80) + 1.0,(pIVar3->InnerClipRect).Min.y);
    fVar14 = ImMin<float>(fVar14,(pIVar3->InnerClipRect).Max.y);
    *(float *)(in_RDI + 0x150) = fVar14;
    *(float *)(in_RDI + 0x130) = fVar14;
    fVar14 = (pIVar3->InnerClipRect).Max.y;
    *(float *)(in_RDI + 0x158) = fVar14;
    *(float *)(in_RDI + 0x138) = fVar14;
    *(undefined1 *)(in_RDI + 0x246) = *(undefined1 *)(in_RDI + 0x247);
    fVar14 = *(float *)(in_RDI + 0x80);
    fVar1 = *(float *)(in_RDI + 0x7c);
    fVar13 = (*(float *)(in_RDI + 0x110) + *(float *)(in_RDI + 0x80)) - *(float *)(in_RDI + 0xf0);
    (pIVar3->DC).CursorPos.y = fVar13;
    *(float *)(in_RDI + 0x80) = fVar13;
    *(float *)(in_RDI + 0x7c) = *(float *)(in_RDI + 0x80) - (fVar14 - fVar1);
    for (local_bc = 0; local_bc < *(int *)(in_RDI + 0x6c); local_bc = local_bc + 1) {
      pIVar10 = ImSpan<ImGuiTableColumn>::operator[]
                          ((ImSpan<ImGuiTableColumn> *)(in_RDI + 0x10),local_bc);
      pIVar10->DrawChannelCurrent = pIVar10->DrawChannelUnfrozen;
      (pIVar10->ClipRect).Min.y = *(float *)(in_RDI + 0x150);
    }
    ImSpan<ImGuiTableColumn>::operator[]((ImSpan<ImGuiTableColumn> *)(in_RDI + 0x10),0);
    SetWindowClipRectBeforeSetChannel(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    iVar17 = (int)((ulong)in_stack_ffffffffffffff20 >> 0x20);
    ImSpan<ImGuiTableColumn>::operator[]((ImSpan<ImGuiTableColumn> *)(in_RDI + 0x10),0);
    ImDrawListSplitter::SetCurrentChannel
              ((ImDrawListSplitter *)CONCAT44(uVar16,in_stack_ffffffffffffff30),
               in_stack_ffffffffffffff28,iVar17);
  }
  if ((*(uint *)(in_RDI + 0x90) & 1) == 0) {
    *(int *)(in_RDI + 0x94) = *(int *)(in_RDI + 0x94) + 1;
  }
  *(undefined1 *)(in_RDI + 0x249) = 0;
  return;
}

Assistant:

void ImGui::TableEndRow(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    IM_ASSERT(window == table->InnerWindow);
    IM_ASSERT(table->IsInsideRow);

    if (table->CurrentColumn != -1)
        TableEndCell(table);

    // Logging
    if (g.LogEnabled)
        LogRenderedText(NULL, "|");

    // Position cursor at the bottom of our row so it can be used for e.g. clipping calculation. However it is
    // likely that the next call to TableBeginCell() will reposition the cursor to take account of vertical padding.
    window->DC.CursorPos.y = table->RowPosY2;

    // Row background fill
    const float bg_y1 = table->RowPosY1;
    const float bg_y2 = table->RowPosY2;
    const bool unfreeze_rows_actual = (table->CurrentRow + 1 == table->FreezeRowsCount);
    const bool unfreeze_rows_request = (table->CurrentRow + 1 == table->FreezeRowsRequest);
    if (table->CurrentRow == 0)
        table->LastFirstRowHeight = bg_y2 - bg_y1;

    const bool is_visible = (bg_y2 >= table->InnerClipRect.Min.y && bg_y1 <= table->InnerClipRect.Max.y);
    if (is_visible)
    {
        // Decide of background color for the row
        ImU32 bg_col0 = 0;
        ImU32 bg_col1 = 0;
        if (table->RowBgColor[0] != IM_COL32_DISABLE)
            bg_col0 = table->RowBgColor[0];
        else if (table->Flags & ImGuiTableFlags_RowBg)
            bg_col0 = GetColorU32((table->RowBgColorCounter & 1) ? ImGuiCol_TableRowBgAlt : ImGuiCol_TableRowBg);
        if (table->RowBgColor[1] != IM_COL32_DISABLE)
            bg_col1 = table->RowBgColor[1];

        // Decide of top border color
        ImU32 border_col = 0;
        const float border_size = TABLE_BORDER_SIZE;
        if (table->CurrentRow > 0 || table->InnerWindow == table->OuterWindow)
            if (table->Flags & ImGuiTableFlags_BordersInnerH)
                border_col = (table->LastRowFlags & ImGuiTableRowFlags_Headers) ? table->BorderColorStrong : table->BorderColorLight;

        const bool draw_cell_bg_color = table->RowCellDataCurrent >= 0;
        const bool draw_strong_bottom_border = unfreeze_rows_actual;
        if ((bg_col0 | bg_col1 | border_col) != 0 || draw_strong_bottom_border || draw_cell_bg_color)
        {
            // In theory we could call SetWindowClipRectBeforeSetChannel() but since we know TableEndRow() is
            // always followed by a change of clipping rectangle we perform the smallest overwrite possible here.
            if ((table->Flags & ImGuiTableFlags_NoClip) == 0)
                window->DrawList->_CmdHeader.ClipRect = table->Bg0ClipRectForDrawCmd.ToVec4();
            table->DrawSplitter.SetCurrentChannel(window->DrawList, TABLE_DRAW_CHANNEL_BG0);
        }

        // Draw row background
        // We soft/cpu clip this so all backgrounds and borders can share the same clipping rectangle
        if (bg_col0 || bg_col1)
        {
            ImRect row_rect(table->WorkRect.Min.x, bg_y1, table->WorkRect.Max.x, bg_y2);
            row_rect.ClipWith(table->BgClipRect);
            if (bg_col0 != 0 && row_rect.Min.y < row_rect.Max.y)
                window->DrawList->AddRectFilled(row_rect.Min, row_rect.Max, bg_col0);
            if (bg_col1 != 0 && row_rect.Min.y < row_rect.Max.y)
                window->DrawList->AddRectFilled(row_rect.Min, row_rect.Max, bg_col1);
        }

        // Draw cell background color
        if (draw_cell_bg_color)
        {
            ImGuiTableCellData* cell_data_end = &table->RowCellData[table->RowCellDataCurrent];
            for (ImGuiTableCellData* cell_data = &table->RowCellData[0]; cell_data <= cell_data_end; cell_data++)
            {
                const ImGuiTableColumn* column = &table->Columns[cell_data->Column];
                ImRect cell_bg_rect = TableGetCellBgRect(table, cell_data->Column);
                cell_bg_rect.ClipWith(table->BgClipRect);
                cell_bg_rect.Min.x = ImMax(cell_bg_rect.Min.x, column->ClipRect.Min.x);     // So that first column after frozen one gets clipped
                cell_bg_rect.Max.x = ImMin(cell_bg_rect.Max.x, column->MaxX);
                window->DrawList->AddRectFilled(cell_bg_rect.Min, cell_bg_rect.Max, cell_data->BgColor);
            }
        }

        // Draw top border
        if (border_col && bg_y1 >= table->BgClipRect.Min.y && bg_y1 < table->BgClipRect.Max.y)
            window->DrawList->AddLine(ImVec2(table->BorderX1, bg_y1), ImVec2(table->BorderX2, bg_y1), border_col, border_size);

        // Draw bottom border at the row unfreezing mark (always strong)
        if (draw_strong_bottom_border && bg_y2 >= table->BgClipRect.Min.y && bg_y2 < table->BgClipRect.Max.y)
            window->DrawList->AddLine(ImVec2(table->BorderX1, bg_y2), ImVec2(table->BorderX2, bg_y2), table->BorderColorStrong, border_size);
    }

    // End frozen rows (when we are past the last frozen row line, teleport cursor and alter clipping rectangle)
    // We need to do that in TableEndRow() instead of TableBeginRow() so the list clipper can mark end of row and
    // get the new cursor position.
    if (unfreeze_rows_request)
        for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        {
            ImGuiTableColumn* column = &table->Columns[column_n];
            column->NavLayerCurrent = (ImS8)((column_n < table->FreezeColumnsCount) ? ImGuiNavLayer_Menu : ImGuiNavLayer_Main);
        }
    if (unfreeze_rows_actual)
    {
        IM_ASSERT(table->IsUnfrozenRows == false);
        table->IsUnfrozenRows = true;

        // BgClipRect starts as table->InnerClipRect, reduce it now and make BgClipRectForDrawCmd == BgClipRect
        float y0 = ImMax(table->RowPosY2 + 1, window->InnerClipRect.Min.y);
        table->BgClipRect.Min.y = table->Bg2ClipRectForDrawCmd.Min.y = ImMin(y0, window->InnerClipRect.Max.y);
        table->BgClipRect.Max.y = table->Bg2ClipRectForDrawCmd.Max.y = window->InnerClipRect.Max.y;
        table->Bg2DrawChannelCurrent = table->Bg2DrawChannelUnfrozen;
        IM_ASSERT(table->Bg2ClipRectForDrawCmd.Min.y <= table->Bg2ClipRectForDrawCmd.Max.y);

        float row_height = table->RowPosY2 - table->RowPosY1;
        table->RowPosY2 = window->DC.CursorPos.y = table->WorkRect.Min.y + table->RowPosY2 - table->OuterRect.Min.y;
        table->RowPosY1 = table->RowPosY2 - row_height;
        for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        {
            ImGuiTableColumn* column = &table->Columns[column_n];
            column->DrawChannelCurrent = column->DrawChannelUnfrozen;
            column->ClipRect.Min.y = table->Bg2ClipRectForDrawCmd.Min.y;
        }

        // Update cliprect ahead of TableBeginCell() so clipper can access to new ClipRect->Min.y
        SetWindowClipRectBeforeSetChannel(window, table->Columns[0].ClipRect);
        table->DrawSplitter.SetCurrentChannel(window->DrawList, table->Columns[0].DrawChannelCurrent);
    }

    if (!(table->RowFlags & ImGuiTableRowFlags_Headers))
        table->RowBgColorCounter++;
    table->IsInsideRow = false;
}